

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-test.c
# Opt level: O0

void event_print(telnet_t *telnet,telnet_event_t *ev,void *ud)

{
  uchar uVar1;
  byte bVar2;
  size_t sVar3;
  char *pcVar4;
  char *local_c8;
  char *local_b0;
  state_t *state;
  size_t i;
  void *ud_local;
  telnet_event_t *ev_local;
  telnet_t *telnet_local;
  
  switch(ev->type) {
  case TELNET_EV_DATA:
    stprintf((state_t *)ud,"DATA [%zi] ==> ",(ev->data).size);
    print_encode((state_t *)ud,(ev->data).buffer,(ev->data).size);
    stprintf((state_t *)ud,"\n");
    break;
  case TELNET_EV_SEND:
    break;
  case TELNET_EV_IAC:
    bVar2 = (ev->iac).cmd;
    pcVar4 = get_cmd((ev->iac).cmd);
    stprintf((state_t *)ud,"IAC %d (%s)\n",(ulong)bVar2,pcVar4);
    break;
  case TELNET_EV_WILL:
    bVar2 = (ev->iac).cmd;
    pcVar4 = get_opt((ev->iac).cmd);
    stprintf((state_t *)ud,"WILL %d (%s)\n",(ulong)bVar2,pcVar4);
    break;
  case TELNET_EV_WONT:
    bVar2 = (ev->iac).cmd;
    pcVar4 = get_opt((ev->iac).cmd);
    stprintf((state_t *)ud,"WONT %d (%s)\n",(ulong)bVar2,pcVar4);
    break;
  case TELNET_EV_DO:
    bVar2 = (ev->iac).cmd;
    pcVar4 = get_opt((ev->iac).cmd);
    stprintf((state_t *)ud,"DO %d (%s)\n",(ulong)bVar2,pcVar4);
    break;
  case TELNET_EV_DONT:
    bVar2 = (ev->iac).cmd;
    pcVar4 = get_opt((ev->iac).cmd);
    stprintf((state_t *)ud,"DONT %d (%s)\n",(ulong)bVar2,pcVar4);
    break;
  case TELNET_EV_SUBNEGOTIATION:
    uVar1 = (ev->sub).telopt;
    if ((((uVar1 != '\x18') && (uVar1 != '$')) && (uVar1 != '\'')) &&
       ((uVar1 != 'F' && (uVar1 != ']')))) {
      bVar2 = (ev->sub).telopt;
      pcVar4 = get_opt((ev->sub).telopt);
      stprintf((state_t *)ud,"SUB %d (%s) [%zi]\n",(ulong)bVar2,pcVar4,(ev->data).size);
    }
    break;
  case TELNET_EV_COMPRESS:
    pcVar4 = "OFF";
    if ((ev->iac).cmd != '\0') {
      pcVar4 = "ON";
    }
    stprintf((state_t *)ud,"COMPRESSION %s\n",pcVar4);
    break;
  case TELNET_EV_ZMP:
    stprintf((state_t *)ud,"ZMP (%s) [%zi]\n",*(ev->zmp).argv,(ev->data).size);
    break;
  case TELNET_EV_TTYPE:
    pcVar4 = "IS";
    if ((ev->iac).cmd != '\0') {
      pcVar4 = "SEND";
    }
    if ((ev->data).buffer == (char *)0x0) {
      local_b0 = "";
    }
    else {
      local_b0 = (ev->data).buffer;
    }
    stprintf((state_t *)ud,"TTYPE %s %s\n",pcVar4,local_b0);
    break;
  case TELNET_EV_ENVIRON:
    if ((ev->sub).telopt == '\0') {
      local_c8 = "IS";
    }
    else {
      local_c8 = "INFO";
      if ((ev->sub).telopt == '\x01') {
        local_c8 = "SEND";
      }
    }
    stprintf((state_t *)ud,"ENVIRON [%zi parts] ==> %s",(ev->data).size,local_c8);
    for (state = (state_t *)0x0; state != (state_t *)(ev->data).size;
        state = (state_t *)((long)&state->expected + 1)) {
      pcVar4 = "USERVAR";
      if ((ev->data).buffer[(long)state * 0x18] == '\0') {
        pcVar4 = "VAR";
      }
      stprintf((state_t *)ud," %s \"",pcVar4);
      if (*(long *)((ev->data).buffer + (long)state * 0x18 + 8) != 0) {
        pcVar4 = *(char **)((ev->data).buffer + (long)state * 0x18 + 8);
        sVar3 = strlen(*(char **)((ev->data).buffer + (long)state * 0x18 + 8));
        print_encode((state_t *)ud,pcVar4,sVar3);
      }
      stprintf((state_t *)ud,"\"");
      if ((ev->sub).telopt != '\x01') {
        stprintf((state_t *)ud,"=\"");
        if (*(long *)((ev->data).buffer + (long)state * 0x18 + 0x10) != 0) {
          pcVar4 = *(char **)((ev->data).buffer + (long)state * 0x18 + 0x10);
          sVar3 = strlen(*(char **)((ev->data).buffer + (long)state * 0x18 + 0x10));
          print_encode((state_t *)ud,pcVar4,sVar3);
        }
        stprintf((state_t *)ud,"\"");
      }
    }
    stprintf((state_t *)ud,"\n");
    break;
  case TELNET_EV_MSSP:
    stprintf((state_t *)ud,"MSSP [%zi] ==>",(ev->data).size);
    for (state = (state_t *)0x0; state != (state_t *)(ev->data).size;
        state = (state_t *)((long)&state->expected + 1)) {
      stprintf((state_t *)ud," \"");
      pcVar4 = *(char **)((ev->data).buffer + (long)state * 0x18 + 8);
      sVar3 = strlen(*(char **)((ev->data).buffer + (long)state * 0x18 + 8));
      print_encode((state_t *)ud,pcVar4,sVar3);
      stprintf((state_t *)ud,"\"=\"");
      pcVar4 = *(char **)((ev->data).buffer + (long)state * 0x18 + 0x10);
      sVar3 = strlen(*(char **)((ev->data).buffer + (long)state * 0x18 + 0x10));
      print_encode((state_t *)ud,pcVar4,sVar3);
      stprintf((state_t *)ud,"\"");
    }
    stprintf((state_t *)ud,"\n");
    break;
  case TELNET_EV_WARNING:
    stprintf((state_t *)ud,"WARNING: %s\n",(ev->error).msg);
    break;
  case TELNET_EV_ERROR:
    stprintf((state_t *)ud,"ERROR: %s\n",(ev->error).msg);
  }
  return;
}

Assistant:

static void event_print(telnet_t *telnet, telnet_event_t *ev, void *ud) {
	size_t i;
	state_t *state;

	(void)telnet;

	state = (state_t *)ud;

	switch (ev->type) {
	case TELNET_EV_DATA:
		stprintf(state, "DATA [%zi] ==> ", ev->data.size);
		print_encode(state, ev->data.buffer, ev->data.size);
		stprintf(state, "\n");
		break;
	case TELNET_EV_SEND:
		break;
	case TELNET_EV_IAC:
		stprintf(state, "IAC %d (%s)\n", (int)ev->iac.cmd, get_cmd(ev->iac.cmd));
		break;
	case TELNET_EV_WILL:
		stprintf(state, "WILL %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_WONT:
		stprintf(state, "WONT %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_DO:
		stprintf(state, "DO %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_DONT:
		stprintf(state, "DONT %d (%s)\n", (int)ev->neg.telopt, get_opt(ev->neg.telopt));
		break;
	case TELNET_EV_SUBNEGOTIATION:
		switch (ev->sub.telopt) {
		case TELNET_TELOPT_ENVIRON:
		case TELNET_TELOPT_NEW_ENVIRON:
		case TELNET_TELOPT_TTYPE:
		case TELNET_TELOPT_ZMP:
		case TELNET_TELOPT_MSSP:
			/* print nothing */
			break;
		default:
			stprintf(state, "SUB %d (%s) [%zi]\n", (int)ev->sub.telopt, get_opt(ev->sub.telopt), ev->sub.size);
			break;
		}
		break;
	case TELNET_EV_ZMP:
		stprintf(state, "ZMP (%s) [%zi]\n", ev->zmp.argv[0], ev->zmp.argc);
		break;
	case TELNET_EV_TTYPE:
		stprintf(state, "TTYPE %s %s\n", ev->ttype.cmd ? "SEND" : "IS",
				ev->ttype.name ? ev->ttype.name : "");
		break;
	/* ENVIRON/NEW-ENVIRON commands */
	case TELNET_EV_ENVIRON:
		stprintf(state, "ENVIRON [%zi parts] ==> %s", ev->environ.size, ev->environ.cmd == TELNET_ENVIRON_IS ? "IS" : (ev->environ.cmd == TELNET_ENVIRON_SEND ? "SEND" : "INFO"));
		for (i = 0; i != ev->environ.size; ++i) {
			stprintf(state, " %s \"", ev->environ.values[i].type == TELNET_ENVIRON_VAR ? "VAR" : "USERVAR");
			if (ev->environ.values[i].var != 0) {
				print_encode(state, ev->environ.values[i].var, strlen(ev->environ.values[i].var));
			}
			stprintf(state, "\"");
			if (ev->environ.cmd != TELNET_ENVIRON_SEND) {
				stprintf(state, "=\"");
				if (ev->environ.values[i].value != 0) {
					print_encode(state, ev->environ.values[i].value, strlen(ev->environ.values[i].value));
				}
				stprintf(state, "\"");
			}
		}
		stprintf(state, "\n");
		break;
	case TELNET_EV_MSSP:
		stprintf(state, "MSSP [%zi] ==>", ev->mssp.size);
		for (i = 0; i != ev->mssp.size; ++i) {
			stprintf(state, " \"");
			print_encode(state, ev->mssp.values[i].var, strlen(ev->mssp.values[i].var));
			stprintf(state, "\"=\"");
			print_encode(state, ev->mssp.values[i].value, strlen(ev->mssp.values[i].value));
			stprintf(state, "\"");
		}
		stprintf(state, "\n");
		break;
	case TELNET_EV_COMPRESS:
		stprintf(state, "COMPRESSION %s\n", ev->compress.state ? "ON" : "OFF");
		break;
	case TELNET_EV_WARNING:
		stprintf(state, "WARNING: %s\n", ev->error.msg);
		break;
	case TELNET_EV_ERROR:
		stprintf(state, "ERROR: %s\n", ev->error.msg);
		break;
	}
}